

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

void __thiscall MNS::Response::Response(Response *this,SocketData *socketData)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  
  p_Var1 = &(this->headers)._M_t._M_impl.super__Rb_tree_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->finished = false;
  this->socketData = socketData;
  this->statusCode = 200;
  this->bufferLen = 0;
  pcVar2 = (char *)malloc(0x1000);
  this->buffer = pcVar2;
  pcVar2 = (char *)malloc(0x1000);
  this->responseBuffer = pcVar2;
  this->bufferSize = 0x1000;
  this->headersSent = false;
  this->sendDate = true;
  this->statusMessage = (char *)0x0;
  return;
}

Assistant:

MNS::Response::Response(const MNS::SocketData *socketData) {
	this->finished = false;
	this->socketData = socketData;

	this->statusCode = 200;

	this->bufferLen = 0;
	this->buffer = (char *)malloc(4096);
	this->responseBuffer = (char *)malloc(4096);
	this->bufferSize = 4096;
	this->headersSent = false;
	this->sendDate = true;
	this->statusMessage = NULL;
	//this->response.reserve(1024);
}